

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O3

MeshXml * Assimp::Ogre::OgreXmlSerializer::ImportMesh(XmlReader *reader)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  MeshXml *this;
  OgreXmlSerializer serializer;
  OgreXmlSerializer local_40;
  
  paVar1 = &local_40.m_currentNodeName.field_2;
  local_40.m_currentNodeName._M_string_length = 0;
  local_40.m_currentNodeName.field_2._M_local_buf[0] = '\0';
  local_40.m_reader = reader;
  local_40.m_currentNodeName._M_dataplus._M_p = (pointer)paVar1;
  this = (MeshXml *)operator_new(0x48);
  MeshXml::MeshXml(this);
  ReadMesh(&local_40,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_currentNodeName._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.m_currentNodeName._M_dataplus._M_p);
  }
  return this;
}

Assistant:

bool OgreXmlSerializer::CurrentNodeNameEquals(const std::string &name) const
{
    return (ASSIMP_stricmp(m_currentNodeName, name) == 0);
}